

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_disp_t read_disp(MIR_context_t ctx)

{
  MIR_error_func_t p_Var1;
  undefined1 local_28 [8];
  token_attr_t attr;
  MIR_context_t pMStack_10;
  bin_tag_t tag;
  MIR_context_t ctx_local;
  
  pMStack_10 = ctx;
  attr._12_4_ = read_token(ctx,(token_attr_t *)local_28);
  if (((uint)attr._12_4_ < TAG_I1) || (TAG_I8 < (uint)attr._12_4_)) {
    p_Var1 = MIR_get_error_func(pMStack_10);
    (*p_Var1)(MIR_binary_io_error,"memory disp has wrong tag %d",(ulong)(uint)attr._12_4_);
  }
  return (uint64_t)local_28;
}

Assistant:

static MIR_disp_t read_disp (MIR_context_t ctx) {
  bin_tag_t tag;
  token_attr_t attr;

  tag = read_token (ctx, &attr);
  if (TAG_I1 > tag || tag > TAG_I8)
    MIR_get_error_func (ctx) (MIR_binary_io_error, "memory disp has wrong tag %d", tag);
  return attr.i;
}